

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall QXmlStreamReaderPrivate::~QXmlStreamReaderPrivate(QXmlStreamReaderPrivate *this)

{
  Attribute *__ptr;
  Data *pDVar1;
  EntityDeclaration *__ptr_00;
  NotationDeclaration *__ptr_01;
  DtdAttribute *__ptr_02;
  QEntityReference *__ptr_03;
  uint *__ptr_04;
  Data *pDVar2;
  Tag *__ptr_05;
  NamespaceDeclaration *__ptr_06;
  
  free(this->sym_stack);
  free(this->state_stack);
  std::unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
  ~unique_ptr(&this->entityParser);
  __ptr = (this->attributeStack).data;
  if (__ptr != (Attribute *)0x0) {
    free(__ptr);
  }
  pDVar1 = (this->textBuffer).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->textBuffer).d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QXmlStreamEntityDeclaration>::~QArrayDataPointer
            (&(this->publicEntityDeclarations).d);
  __ptr_00 = (this->entityDeclarations).data;
  if (__ptr_00 != (EntityDeclaration *)0x0) {
    free(__ptr_00);
  }
  QArrayDataPointer<QXmlStreamNamespaceDeclaration>::~QArrayDataPointer
            (&(this->publicNamespaceDeclarations).d);
  QArrayDataPointer<QXmlStreamNotationDeclaration>::~QArrayDataPointer
            (&(this->publicNotationDeclarations).d);
  __ptr_01 = (this->notationDeclarations).data;
  if (__ptr_01 != (NotationDeclaration *)0x0) {
    free(__ptr_01);
  }
  __ptr_02 = (this->dtdAttributes).data;
  if (__ptr_02 != (DtdAttribute *)0x0) {
    free(__ptr_02);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
            ((QArrayDataPointer<QXmlStreamAttribute> *)&this->attributes);
  pDVar1 = (this->unresolvedEntity).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->unresolvedEntity).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->errorString).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->errorString).d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringConverterBase::State::clear(&(this->decoder).super_QStringConverter.state);
  __ptr_03 = (this->entityReferenceStack).data;
  if (__ptr_03 != (QEntityReference *)0x0) {
    free(__ptr_03);
  }
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::~QHash(&this->parameterEntityHash);
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::~QHash(&this->entityHash);
  __ptr_04 = (this->putStack).data;
  if (__ptr_04 != (uint *)0x0) {
    free(__ptr_04);
  }
  pDVar1 = (this->readBuffer).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->readBuffer).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->dataBuffer).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->dataBuffer).d.d)->super_QArrayData,1,0x10);
    }
  }
  pDVar2 = (this->rawReadBuffer).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->rawReadBuffer).d.d)->super_QArrayData,1,0x10);
    }
  }
  __ptr_05 = (this->super_QXmlStreamPrivateTagStack).tagStack.data;
  if (__ptr_05 != (Tag *)0x0) {
    free(__ptr_05);
  }
  pDVar1 = (this->super_QXmlStreamPrivateTagStack).tagStackStringStorage.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate
                (&((this->super_QXmlStreamPrivateTagStack).tagStackStringStorage.d.d)->
                  super_QArrayData,2,0x10);
    }
  }
  __ptr_06 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
  if (__ptr_06 != (NamespaceDeclaration *)0x0) {
    free(__ptr_06);
    return;
  }
  return;
}

Assistant:

QXmlStreamReaderPrivate::~QXmlStreamReaderPrivate()
{
    free(sym_stack);
    free(state_stack);
}